

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall cmComputeComponentGraph::Tarjan(cmComputeComponentGraph *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar1;
  size_type __new_size;
  ulong uVar2;
  TarjanEntry entry;
  value_type_conflict1 local_3c;
  value_type local_38;
  
  uVar1 = (int)((long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_38.Root = 0;
  local_38.VisitIndex = 0;
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,0);
  __new_size = (size_type)(int)uVar1;
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::resize(&this->TarjanEntries,__new_size,&local_38);
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,0);
  local_3c = -1;
  std::vector<int,_std::allocator<int>_>::resize(&this->TarjanComponents,__new_size,&local_3c);
  this->TarjanWalkId = 0;
  this_00 = &this->TarjanVisited;
  std::vector<int,_std::allocator<int>_>::resize(this_00,0);
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size,&local_3c);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar2] == 0) {
        if ((this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur !=
            (this->TarjanStack).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) {
          __assert_fail("this->TarjanStack.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmComputeComponentGraph.cxx"
                        ,0x35,"void cmComputeComponentGraph::Tarjan()");
        }
        this->TarjanWalkId = this->TarjanWalkId + 1;
        this->TarjanIndex = 0;
        TarjanVisit(this,(int)uVar2);
      }
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  return;
}

Assistant:

void cmComputeComponentGraph::Tarjan()
{
  int n = static_cast<int>(this->InputGraph.size());
  TarjanEntry entry = {0,0};
  this->TarjanEntries.resize(0);
  this->TarjanEntries.resize(n, entry);
  this->TarjanComponents.resize(0);
  this->TarjanComponents.resize(n, -1);
  this->TarjanWalkId = 0;
  this->TarjanVisited.resize(0);
  this->TarjanVisited.resize(n, 0);
  for(int i = 0; i < n; ++i)
    {
    // Start a new DFS from this node if it has never been visited.
    if(!this->TarjanVisited[i])
      {
      assert(this->TarjanStack.empty());
      ++this->TarjanWalkId;
      this->TarjanIndex = 0;
      this->TarjanVisit(i);
      }
    }
}